

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O0

string * ensure_one_newline(string *s)

{
  string *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined8 local_78 [3];
  char local_59;
  char *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  string local_38 [8];
  string str;
  string *s_local;
  
  std::__cxx11::string::string(local_38,in_RSI);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58 = (char *)std::__cxx11::string::end();
  local_59 = '\n';
  local_48 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_58,&local_59);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
  local_80._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)local_78,&local_80);
  std::__cxx11::string::erase(local_38,local_40,local_78[0]);
  std::operator+(s,(char *)local_38);
  std::__cxx11::string::~string(local_38);
  return s;
}

Assistant:

string ensure_one_newline(const string &s) {
    string str(s);
    str.erase(std::remove(str.begin(), str.end(), '\n'), str.end());
    return str + "\n";
}